

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSchur.h
# Opt level: O2

void __thiscall
Eigen::RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::computeShift
          (RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *this,Index iu,Index iter,
          Scalar *exshift,Vector3s *shiftInfo)

{
  double dVar1;
  Index i_1;
  long lVar2;
  RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *pRVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  Scalar local_28;
  
  dVar6 = (this->m_matT).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
          m_data.array[iu * 3];
  (shiftInfo->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [0] = dVar6;
  dVar1 = (this->m_matT).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
          m_data.array[iu * 3 + -3];
  (shiftInfo->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [1] = dVar1;
  dVar5 = (this->m_matT).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
          m_data.array[iu * 3 + -2] *
          (this->m_matT).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
          m_data.array[iu * 3 + -1];
  (shiftInfo->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [2] = dVar5;
  if (iter == 0x1e) {
    dVar6 = (dVar1 - dVar6) * 0.5;
    dVar5 = dVar6 * dVar6 + dVar5;
    if (0.0 < dVar5) {
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      dVar6 = (shiftInfo->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[0];
      dVar1 = (shiftInfo->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1];
      uVar4 = -(ulong)(dVar1 < dVar6);
      dVar6 = dVar6 - (shiftInfo->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                      m_storage.m_data.array[2] /
                      ((dVar1 - dVar6) * 0.5 +
                      (double)(~uVar4 & (ulong)dVar5 | (ulong)-dVar5 & uVar4));
      *exshift = *exshift + dVar6;
      for (lVar2 = 0; lVar2 <= iu; lVar2 = lVar2 + 1) {
        (this->m_matT).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data
        .array[0] = (this->m_matT).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                    m_storage.m_data.array[0] - dVar6;
        this = (RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
               ((this->m_matT).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                m_storage.m_data.array + 3);
      }
      local_28 = 0.964;
      DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setConstant
                ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)shiftInfo,&local_28);
    }
  }
  else if (iter == 10) {
    *exshift = dVar6 + *exshift;
    pRVar3 = this;
    for (lVar2 = 0; lVar2 <= iu; lVar2 = lVar2 + 1) {
      (pRVar3->m_matT).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data
      .array[0] = (pRVar3->m_matT).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                  m_storage.m_data.array[0] -
                  (shiftInfo->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                  m_storage.m_data.array[0];
      pRVar3 = (RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
               ((pRVar3->m_matT).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                m_storage.m_data.array + 3);
    }
    dVar6 = ABS((this->m_matT).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                m_storage.m_data.array[iu * 3 + -5]) +
            ABS((this->m_matT).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                m_storage.m_data.array[iu * 3 + -2]);
    (shiftInfo->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
    [0] = dVar6 * 0.75;
    (shiftInfo->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
    [1] = dVar6 * 0.75;
    (shiftInfo->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
    [2] = dVar6 * -0.4375 * dVar6;
  }
  return;
}

Assistant:

inline void RealSchur<MatrixType>::computeShift(Index iu, Index iter, Scalar& exshift, Vector3s& shiftInfo)
{
  using std::sqrt;
  using std::abs;
  shiftInfo.coeffRef(0) = m_matT.coeff(iu,iu);
  shiftInfo.coeffRef(1) = m_matT.coeff(iu-1,iu-1);
  shiftInfo.coeffRef(2) = m_matT.coeff(iu,iu-1) * m_matT.coeff(iu-1,iu);

  // Wilkinson's original ad hoc shift
  if (iter == 10)
  {
    exshift += shiftInfo.coeff(0);
    for (Index i = 0; i <= iu; ++i)
      m_matT.coeffRef(i,i) -= shiftInfo.coeff(0);
    Scalar s = abs(m_matT.coeff(iu,iu-1)) + abs(m_matT.coeff(iu-1,iu-2));
    shiftInfo.coeffRef(0) = Scalar(0.75) * s;
    shiftInfo.coeffRef(1) = Scalar(0.75) * s;
    shiftInfo.coeffRef(2) = Scalar(-0.4375) * s * s;
  }

  // MATLAB's new ad hoc shift
  if (iter == 30)
  {
    Scalar s = (shiftInfo.coeff(1) - shiftInfo.coeff(0)) / Scalar(2.0);
    s = s * s + shiftInfo.coeff(2);
    if (s > Scalar(0))
    {
      s = sqrt(s);
      if (shiftInfo.coeff(1) < shiftInfo.coeff(0))
        s = -s;
      s = s + (shiftInfo.coeff(1) - shiftInfo.coeff(0)) / Scalar(2.0);
      s = shiftInfo.coeff(0) - shiftInfo.coeff(2) / s;
      exshift += s;
      for (Index i = 0; i <= iu; ++i)
        m_matT.coeffRef(i,i) -= s;
      shiftInfo.setConstant(Scalar(0.964));
    }
  }
}